

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

void Nwk_ObjSetVisitedBot(Nwk_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  iVar1 = pObj->pMan->nTravIds;
  iVar2 = iVar1 + -2;
  if ((iVar1 + -2 <= pObj->TravId) && (iVar2 = iVar1, pObj->TravId != iVar1 + -1)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkFlow.c"
                  ,0x49,"void Nwk_ObjSetVisitedBot(Nwk_Obj_t *)");
  }
  pObj->TravId = iVar2;
  return;
}

Assistant:

static inline void Nwk_ObjSetVisitedBot( Nwk_Obj_t * pObj )  
{
    if ( pObj->TravId < pObj->pMan->nTravIds - 2 )
        pObj->TravId = pObj->pMan->nTravIds - 2;
    else if ( pObj->TravId == pObj->pMan->nTravIds - 1 )
        pObj->TravId = pObj->pMan->nTravIds;
    else
        assert( 0 );
}